

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::matrices_to_symms(Omega_h *this,Reals *matrices,Int dim)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar1;
  Reals RVar2;
  Read<double> local_60;
  Read<double> local_50 [2];
  Read<double> local_30;
  Int local_1c;
  Reals *pRStack_18;
  Int dim_local;
  Reals *matrices_local;
  
  local_1c = dim;
  pRStack_18 = matrices;
  matrices_local = (Reals *)this;
  if (dim == 3) {
    Read<double>::Read(&local_30,matrices);
    matrices_to_symms_dim<3>(this,&local_30);
    Read<double>::~Read(&local_30);
    pvVar1 = extraout_RDX;
  }
  else if (dim == 2) {
    Read<double>::Read(local_50,matrices);
    matrices_to_symms_dim<2>(this,local_50);
    Read<double>::~Read(local_50);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if (dim != 1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x93);
    }
    Read<double>::Read(&local_60,matrices);
    matrices_to_symms_dim<1>(this,&local_60);
    Read<double>::~Read(&local_60);
    pvVar1 = extraout_RDX_01;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals matrices_to_symms(Reals const matrices, Int const dim) {
  if (dim == 3) return matrices_to_symms_dim<3>(matrices);
  if (dim == 2) return matrices_to_symms_dim<2>(matrices);
  if (dim == 1) return matrices_to_symms_dim<1>(matrices);
  OMEGA_H_NORETURN(Reals());
}